

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

int impl_sign_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *private_key,
                     uint8_t *public_key,uint8_t *msg,size_t msglen,uint8_t *signature,
                     size_t *signature_len)

{
  byte bVar1;
  uint16_t *challengeC;
  uint16_t *puVar2;
  proof2_t *ppVar3;
  _Bool _Var4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  randomTape_t *__ptr;
  tree_t *__ptr_00;
  commitments_t *commitments;
  inputs_t inputs;
  msgs_t *msgs;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint16_t *missingLeaves;
  ulong uVar10;
  ulong uVar11;
  uint8_t *aux;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  msgs_t *pmVar15;
  size_t sVar16;
  randomTape_t *prVar17;
  uint uVar18;
  uint16_t uVar19;
  long lVar20;
  proof2_t *proof;
  size_t i;
  commitments_t *C;
  tree_t *ptVar21;
  ulong uVar22;
  BitSequence **data;
  signature2_t sig;
  commitments_t Cv;
  commitments_t Ch;
  size_t cvInfoLen;
  tree_t iSeedsTree;
  uint8_t saltAndRoot [64];
  mzd_local_t m_plaintext [1];
  tree_t treeCv;
  hash_context ctx;
  int local_540;
  undefined1 local_4e0 [16];
  uint8_t *puStack_4d0;
  uint8_t *puStack_4c8;
  uint8_t *local_4c0;
  size_t local_4b8;
  uint8_t *local_4b0;
  size_t local_4a8;
  uint8_t *local_4a0;
  uint16_t *local_498;
  uint16_t *local_490;
  proof2_t *local_488;
  commitments_t local_480;
  commitments_t local_470;
  uint8_t *local_460;
  lowmc_simulate_online_f local_458;
  uint8_t *local_450;
  size_t local_448;
  tree_t local_440;
  uint8_t *local_420;
  uint8_t *puStack_418;
  uint8_t *puStack_410;
  uint8_t *puStack_408;
  uint8_t local_400 [32];
  mzd_local_t local_3e0;
  tree_t local_3c0;
  undefined1 local_3a0 [8];
  uint8_t *puStack_398;
  uint8_t *puStack_390;
  uint8_t *puStack_388;
  
  _Var4 = allocateSignature2((signature2_t *)local_4e0,instance);
  local_540 = -1;
  if (!_Var4) goto LAB_0011d039;
  bVar1 = instance->seed_size;
  if (instance->digest_size == ' ') {
    uVar18 = 0x540;
    uVar6 = 0x100;
  }
  else {
    uVar18 = 0x440;
    uVar6 = 0x200;
  }
  Keccak_HashInitialize((Keccak_HashInstance *)local_3a0,uVar18,uVar6,0,'\x1f');
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,private_key,
                    (ulong)instance->input_output_size << 3);
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,msg,msglen * 8);
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,public_key,
                    (ulong)instance->input_output_size << 3);
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,plaintext,
                    (ulong)instance->input_output_size << 3);
  local_420 = (uint8_t *)CONCAT62(local_420._2_6_,(instance->lowmc).n);
  Keccak_HashUpdate((Keccak_HashInstance *)local_3a0,(BitSequence *)&local_420,0x10);
  Keccak_HashFinal((Keccak_HashInstance *)local_3a0,(BitSequence *)0x0);
  Keccak_HashSqueeze((Keccak_HashInstance *)local_3a0,(BitSequence *)&local_420,
                     (ulong)bVar1 * 8 + 0x100);
  local_4e0._0_8_ = local_420;
  local_4e0._8_8_ = puStack_418;
  puStack_4d0 = puStack_410;
  puStack_4c8 = puStack_408;
  _Var4 = generateSeeds(&local_440,(uint)instance->num_rounds,local_400,local_4e0,0,instance);
  if (!_Var4) {
    local_540 = -1;
    goto LAB_0011d039;
  }
  local_450 = getLeaves(&local_440);
  local_540 = -1;
  if (local_450 == (uint8_t *)0x0) {
    clearTree(&local_440);
    goto LAB_0011d039;
  }
  uVar5 = instance->num_rounds;
  local_460 = msg;
  __ptr = (randomTape_t *)calloc((ulong)uVar5,0x98);
  __ptr_00 = (tree_t *)calloc((ulong)uVar5,0x20);
  commitments = allocateCommitments(instance,0);
  inputs = allocateInputs(instance);
  msgs = allocateMsgs(instance);
  local_540 = -1;
  if ((msgs != (msgs_t *)0x0 && (inputs != (inputs_t)0x0 && commitments != (commitments_t *)0x0)) &&
      (__ptr_00 != (tree_t *)0x0 && __ptr != (randomTape_t *)0x0)) {
    allocateCommitments2(&local_470,instance,(ulong)instance->num_rounds);
    allocateCommitments2(&local_480,instance,(ulong)instance->num_rounds);
    local_3e0.w64 = (word  [4])ZEXT1632(ZEXT816(0) << 0x40);
    mzd_from_char_array(&local_3e0,plaintext,(ulong)instance->input_output_size);
    local_458 = lowmc_simulate_online_get_implementation(&instance->lowmc);
    if (instance->num_rounds == 0) {
      uVar10 = 0;
      uVar14 = 0;
    }
    else {
      sVar13 = 0;
      do {
        ptVar21 = __ptr_00 + sVar13;
        _Var4 = generateSeeds(ptVar21,(uint)instance->num_MPC_parties,
                              local_450 + instance->seed_size * sVar13,local_4e0,sVar13,instance);
        if (!_Var4) {
          local_540 = -1;
          goto LAB_0011cc6f;
        }
        prVar17 = __ptr + sVar13;
        puVar8 = getLeaves(ptVar21);
        createRandomTapes(prVar17,puVar8,local_4e0,sVar13,instance);
        computeAuxTape(prVar17,inputs[sVar13],instance);
        if (instance->num_MPC_parties == '\0') {
          uVar6 = 0xffffffff;
        }
        else {
          lVar20 = 0;
          sVar12 = 0;
          do {
            uVar6 = (uint)sVar12;
            local_3a0 = (undefined1  [8])getLeaf(ptVar21,uVar6);
            puStack_398 = getLeaf(ptVar21,uVar6 + 1);
            puStack_390 = getLeaf(ptVar21,uVar6 + 2);
            puStack_388 = getLeaf(ptVar21,uVar6 + 3);
            commit_x4((uint8_t **)((long)commitments[sVar13].hashes + lVar20),(uint8_t **)local_3a0,
                      local_4e0,sVar13,sVar12,instance);
            sVar12 = sVar12 + 4;
            lVar20 = lVar20 + 0x20;
          } while (sVar12 < instance->num_MPC_parties);
          uVar6 = instance->num_MPC_parties - 1;
        }
        puVar8 = commitments[sVar13].hashes[(int)uVar6];
        puVar9 = getLeaf(ptVar21,uVar6);
        commit(puVar8,puVar9,prVar17->aux_bits,local_4e0,sVar13,(long)(int)uVar6,instance);
        sVar13 = sVar13 + 1;
      } while (sVar13 < instance->num_rounds);
      if (instance->num_rounds == 0) {
        uVar10 = 0;
      }
      else {
        uVar14 = 0;
        do {
          puVar8 = inputs[uVar14];
          bVar1 = instance->input_output_size;
          if ((ulong)bVar1 == 0) {
            sVar13 = 0;
          }
          else {
            uVar10 = 0;
            do {
              puVar8[uVar10] = puVar8[uVar10] ^ private_key[uVar10];
              uVar10 = uVar10 + 1;
            } while (bVar1 != uVar10);
            sVar13 = (size_t)instance->input_output_size;
          }
          uVar5 = (instance->lowmc).n;
          uVar10 = (ulong)uVar5;
          if ((uint)uVar5 < (uint)((int)sVar13 * 8)) {
            do {
              bVar1 = (byte)uVar10;
              uVar11 = uVar10 >> 3;
              uVar10 = uVar10 + 1;
              bVar1 = ~bVar1 & 7;
              puVar8[uVar11] = puVar8[uVar11] & (-2 << bVar1 | 0xfeU >> 8 - bVar1);
              sVar13 = (size_t)instance->input_output_size;
            } while (uVar10 < (uint)instance->input_output_size * 8);
          }
          local_3a0 = (undefined1  [8])0x0;
          puStack_398 = (uint8_t *)0x0;
          puStack_390 = (uint8_t *)0x0;
          puStack_388 = (uint8_t *)0x0;
          mzd_from_char_array((mzd_local_t *)local_3a0,puVar8,sVar13);
          iVar7 = (*local_458)((mzd_local_t *)local_3a0,__ptr + uVar14,msgs + uVar14,&local_3e0,
                               public_key,instance);
          if (iVar7 != 0) {
            local_540 = -1;
            goto LAB_0011cc6f;
          }
          uVar10 = (ulong)instance->num_rounds;
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar10);
        if (3 < instance->num_rounds) {
          uVar14 = 0;
          pmVar15 = msgs + 3;
          do {
            commit_h_x4(local_470.hashes + uVar14,commitments + uVar14,instance);
            data = local_480.hashes + uVar14;
            if (instance->digest_size == ' ') {
              uVar18 = 0x540;
              uVar6 = 0x100;
            }
            else {
              uVar18 = 0x440;
              uVar6 = 0x200;
            }
            Keccak_HashInitializetimes4
                      ((Keccak_HashInstancetimes4 *)local_3a0,uVar18,uVar6,0,'\x1f');
            Keccak_HashUpdatetimes4
                      ((Keccak_HashInstancetimes4 *)local_3a0,inputs + uVar14,
                       (ulong)instance->input_output_size << 3);
            if (instance->num_MPC_parties != '\0') {
              uVar10 = 0;
              do {
                local_420 = pmVar15[-3].msgs[uVar10];
                puStack_418 = pmVar15[-2].msgs[uVar10];
                puStack_410 = pmVar15[-1].msgs[uVar10];
                puStack_408 = pmVar15->msgs[uVar10];
                Keccak_HashUpdatetimes4
                          ((Keccak_HashInstancetimes4 *)local_3a0,&local_420,
                           (ulong)((int)msgs[uVar14].pos + 7U & 0xfffffff8));
                uVar10 = uVar10 + 1;
              } while (uVar10 < instance->num_MPC_parties);
            }
            Keccak_HashFinaltimes4((Keccak_HashInstancetimes4 *)local_3a0,(BitSequence **)0x0);
            Keccak_HashSqueezetimes4
                      ((Keccak_HashInstancetimes4 *)local_3a0,data,(ulong)instance->digest_size << 3
                      );
            uVar10 = (ulong)instance->num_rounds;
            pmVar15 = pmVar15 + 4;
            uVar14 = uVar14 + 4;
          } while (uVar14 < (instance->num_rounds & 0xfffffffc));
          goto LAB_0011c888;
        }
      }
      uVar14 = 0;
    }
LAB_0011c888:
    uVar5 = (ushort)uVar10;
    if (uVar14 < uVar10) {
      C = commitments + uVar14;
      pmVar15 = msgs + uVar14;
      do {
        commit_h(local_470.hashes[uVar14],C,instance);
        commit_v(local_480.hashes[uVar14],inputs[uVar14],pmVar15,instance);
        uVar5 = instance->num_rounds;
        uVar14 = uVar14 + 1;
        pmVar15 = pmVar15 + 1;
        C = C + 1;
      } while (uVar14 < uVar5);
    }
    _Var4 = createTree(&local_3c0,(uint)uVar5,(uint)instance->digest_size);
    local_540 = -1;
    if (_Var4) {
      buildMerkleTree(&local_3c0,local_480.hashes,local_4e0,instance);
      puVar2 = local_490;
      challengeC = local_498;
      HCP(local_4a0,local_498,local_490,&local_470,local_3c0.nodes,local_4e0,public_key,plaintext,
          local_460,msglen,instance);
      uVar5 = instance->num_rounds;
      bVar1 = instance->num_opened_rounds;
      missingLeaves = getMissingLeavesList(challengeC,(picnic_instance_t *)(ulong)uVar5);
      local_448 = 0;
      puVar8 = openMerkleTree(&local_3c0,missingLeaves,(long)(ulong)uVar5 - (ulong)bVar1,&local_448)
      ;
      free(missingLeaves);
      clearTree(&local_3c0);
      if (puVar8 == (uint8_t *)0x0) goto LAB_0011cc6f;
      local_4a8 = local_448;
      sVar16 = (ulong)instance->seed_size * (ulong)instance->num_rounds;
      local_4b0 = puVar8;
      local_4c0 = (uint8_t *)malloc(sVar16);
      local_4b8 = revealSeeds(&local_440,challengeC,(ulong)instance->num_opened_rounds,local_4c0,
                              sVar16,instance);
      local_4c0 = (uint8_t *)realloc(local_4c0,local_4b8);
      ppVar3 = local_488;
      uVar5 = instance->num_rounds;
      if (uVar5 != 0) {
        sVar13 = 0;
        do {
          uVar10 = (ulong)instance->num_opened_rounds;
          if (uVar10 != 0) {
            uVar19 = (uint16_t)sVar13;
            if (*challengeC != uVar19) {
              uVar14 = 0;
              do {
                if (uVar10 - 1 == uVar14) goto LAB_0011cc54;
                uVar11 = uVar14 + 1;
                lVar20 = uVar14 + 1;
                uVar14 = uVar11;
              } while (challengeC[lVar20] != uVar19);
              if (uVar10 <= uVar11) goto LAB_0011cc54;
            }
            proof = ppVar3 + sVar13;
            allocateProof2(proof,instance);
            uVar10 = 0xffffffffffffffff;
            if ((ulong)instance->num_opened_rounds != 0) {
              uVar14 = 0;
              do {
                uVar10 = uVar14;
                if (challengeC[uVar14] == uVar19) break;
                uVar14 = uVar14 + 1;
                uVar10 = 0xffffffffffffffff;
              } while (instance->num_opened_rounds != uVar14);
            }
            uVar19 = puVar2[uVar10];
            proof->unOpenedIndex = uVar19;
            local_3a0._0_2_ = uVar19;
            sVar16 = (ulong)instance->seed_size * (ulong)instance->num_MPC_parties;
            puVar8 = (uint8_t *)malloc(sVar16);
            proof->seedInfo = puVar8;
            sVar12 = revealSeeds(__ptr_00 + sVar13,(uint16_t *)local_3a0,1,puVar8,sVar16,instance);
            proof->seedInfoLen = sVar12;
            puVar8 = (uint8_t *)realloc(proof->seedInfo,sVar12);
            proof->seedInfo = puVar8;
            if ((ulong)instance->num_MPC_parties - 1 != (ulong)puVar2[uVar10]) {
              memcpy(proof->aux,__ptr[sVar13].aux_bits,(ulong)instance->view_size);
            }
            memcpy(proof->input,inputs[sVar13],(ulong)instance->input_output_size);
            memcpy(proof->msgs,msgs[sVar13].msgs[puVar2[uVar10]],(ulong)instance->view_size);
            bVar1 = instance->num_MPC_parties;
            uVar5 = proof->unOpenedIndex;
            puVar8 = proof->C;
            puVar9 = getLeaf(__ptr_00 + sVar13,(uint)uVar5);
            if (bVar1 - 1 == (uint)uVar5) {
              aux = __ptr[sVar13].aux_bits;
            }
            else {
              aux = (uint8_t *)0x0;
            }
            commit(puVar8,puVar9,aux,local_4e0,sVar13,(ulong)proof->unOpenedIndex,instance);
            uVar5 = instance->num_rounds;
          }
LAB_0011cc54:
          sVar13 = sVar13 + 1;
        } while (sVar13 < uVar5);
        local_540 = 0;
        goto LAB_0011cc6f;
      }
      local_540 = 0;
    }
    else {
LAB_0011cc6f:
      if (instance->num_rounds != 0) {
        uVar10 = 0;
        prVar17 = __ptr;
        ptVar21 = __ptr_00;
        do {
          freeRandomTape(prVar17);
          clearTree(ptVar21);
          uVar10 = uVar10 + 1;
          ptVar21 = ptVar21 + 1;
          prVar17 = prVar17 + 1;
        } while (uVar10 < instance->num_rounds);
      }
    }
    freeCommitments2(&local_480);
    freeCommitments2(&local_470);
  }
  freeMsgs(msgs);
  freeInputs(inputs);
  freeCommitments(commitments);
  free(__ptr_00);
  free(__ptr);
  clearTree(&local_440);
  sVar16 = local_4a8;
  sVar13 = local_4b8;
  if (local_540 == 0) {
    bVar1 = instance->digest_size;
    uVar10 = (ulong)bVar1 + 0x20 + local_4a8 + local_4b8;
    if ((ulong)instance->num_rounds != 0) {
      uVar11 = (ulong)instance->num_opened_rounds;
      uVar14 = 0;
      do {
        if (uVar11 != 0) {
          if (uVar14 != *local_498) {
            uVar22 = 0;
            do {
              if (uVar11 - 1 == uVar22) goto LAB_0011ce23;
              lVar20 = uVar22 + 1;
              uVar22 = uVar22 + 1;
            } while (uVar14 != local_498[lVar20]);
            if (uVar11 <= uVar22) goto LAB_0011ce23;
          }
          lVar20 = 0;
          uVar22 = 0;
          do {
            if (uVar14 == local_498[uVar22]) {
              lVar20 = lVar20 >> 0x20;
              goto LAB_0011cdee;
            }
            uVar22 = uVar22 + 1;
            lVar20 = lVar20 + 0x100000000;
          } while (uVar11 != uVar22);
          lVar20 = -1;
LAB_0011cdee:
          uVar22 = (ulong)instance->view_size;
          if (instance->num_MPC_parties - 1 == (uint)local_490[lVar20]) {
            uVar22 = 0;
          }
          uVar10 = uVar10 + ((uint)instance->input_output_size + (uint)bVar1 +
                            (uint)instance->view_size) + local_488[uVar14].seedInfoLen + uVar22;
        }
LAB_0011ce23:
        uVar14 = uVar14 + 1;
      } while (uVar14 != instance->num_rounds);
    }
    local_540 = -1;
    if (uVar10 <= *signature_len) {
      memcpy(signature,local_4a0,(ulong)bVar1);
      bVar1 = instance->digest_size;
      puVar8 = signature + (ulong)bVar1 + 0x20;
      *(undefined8 *)(puVar8 + -0x20) = local_4e0._0_8_;
      *(undefined8 *)(puVar8 + -0x18) = local_4e0._8_8_;
      *(uint8_t **)(puVar8 + -0x10) = puStack_4d0;
      *(uint8_t **)(puVar8 + -8) = puStack_4c8;
      memcpy(puVar8,local_4c0,sVar13);
      memcpy(signature + sVar13 + 0x20 + (ulong)bVar1,local_4b0,sVar16);
      uVar5 = instance->num_rounds;
      if (uVar5 != 0) {
        puVar8 = signature + sVar13 + 0x20 + (ulong)bVar1 + sVar16;
        uVar14 = 0;
        do {
          uVar11 = (ulong)instance->num_opened_rounds;
          if (uVar11 != 0) {
            if (uVar14 != *local_498) {
              uVar22 = 0;
              do {
                if (uVar11 - 1 == uVar22) goto LAB_0011d00e;
                lVar20 = uVar22 + 1;
                uVar22 = uVar22 + 1;
              } while (uVar14 != local_498[lVar20]);
              if (uVar11 <= uVar22) goto LAB_0011d00e;
            }
            memcpy(puVar8,local_488[uVar14].seedInfo,local_488[uVar14].seedInfoLen);
            uVar11 = 0xffffffffffffffff;
            if ((ulong)instance->num_opened_rounds != 0) {
              uVar22 = 0;
              do {
                uVar11 = uVar22;
                if (uVar14 == local_498[uVar22]) break;
                uVar22 = uVar22 + 1;
                uVar11 = 0xffffffffffffffff;
              } while (instance->num_opened_rounds != uVar22);
            }
            puVar8 = puVar8 + local_488[uVar14].seedInfoLen;
            if (instance->num_MPC_parties - 1 != (uint)local_490[uVar11]) {
              memcpy(puVar8,local_488[uVar14].aux,(ulong)instance->view_size);
              puVar8 = puVar8 + instance->view_size;
            }
            memcpy(puVar8,local_488[uVar14].input,(ulong)instance->input_output_size);
            puVar8 = puVar8 + instance->input_output_size;
            memcpy(puVar8,local_488[uVar14].msgs,(ulong)instance->view_size);
            bVar1 = instance->view_size;
            memcpy(puVar8 + bVar1,local_488[uVar14].C,(ulong)instance->digest_size);
            uVar5 = instance->num_rounds;
            puVar8 = puVar8 + bVar1 + instance->digest_size;
          }
LAB_0011d00e:
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar5);
      }
      local_540 = -1;
      if ((int)uVar10 != -1) {
        local_540 = 0;
        *signature_len = (long)(int)uVar10;
      }
    }
  }
LAB_0011d039:
  freeSignature2((signature2_t *)local_4e0,instance);
  return local_540;
}

Assistant:

int impl_sign_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                      const uint8_t* private_key, const uint8_t* public_key, const uint8_t* msg,
                      size_t msglen, uint8_t* signature, size_t* signature_len) {
  signature2_t sig;
  int ret = -1;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = sign_picnic3(private_key, public_key, plaintext, msg, msglen, &sig, instance);
  picnic_declassify(&ret, sizeof(ret));
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to create signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = serializeSignature2(&sig, signature, *signature_len, instance);
  if (ret == -1) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to serialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }
  *signature_len = ret;
  ret            = 0;

Exit:
  freeSignature2(&sig, instance);
  return ret;
}